

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ProgressUpdateEvent>::destruct
          (BasicTypeInfo<dap::ProgressUpdateEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ProgressUpdateEvent> *this_local;
  
  ProgressUpdateEvent::~ProgressUpdateEvent((ProgressUpdateEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }